

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

BinaryOperator * __thiscall
soul::heart::Parser::parseBinaryOp(Parser *this,FunctionParseState *state,Op opType)

{
  bool bVar1;
  int iVar2;
  Expression *args_1;
  Expression *args_2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Module *this_01;
  BinaryOperator *pBVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  Op opType_local;
  CodeLocation pos;
  char *local_110;
  string local_108;
  string local_e8;
  BinaryOperatorTypes binOpTypes;
  CompileMessage local_98;
  CompileMessage local_60;
  Type *this_00;
  
  pos.sourceCode.object =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.sourceCode.object;
  if (pos.sourceCode.object != (SourceCodeText *)0x0) {
    ((pos.sourceCode.object)->super_RefCountedObject).refCount =
         ((pos.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  pos.location.data =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  opType_local = opType;
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x29b537);
  args_1 = parseExpression(this,state);
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x275d9e);
  args_2 = parseExpression(this,state);
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x299119);
  iVar2 = (*(args_1->super_Object)._vptr_Object[2])(args_1);
  this_00 = (Type *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*(args_2->super_Object)._vptr_Object[2])(args_2);
  bVar1 = Type::isEqual(this_00,(Type *)CONCAT44(extraout_var_00,iVar2),1);
  if (bVar1) {
    BinaryOp::getTypes(&binOpTypes,opType,this_00,this_00);
    bVar1 = Type::isEqual(&binOpTypes.operandType,this_00,1);
    if (bVar1) {
      this_01 = pool_ptr<soul::Module>::operator->(&this->module);
      pBVar3 = Module::
               allocate<soul::heart::BinaryOperator,soul::CodeLocation&,soul::heart::Expression&,soul::heart::Expression&,soul::BinaryOp::Op&>
                         (this_01,&pos,args_1,args_2,&opType_local);
      TypeRules::BinaryOperatorTypes::~BinaryOperatorTypes(&binOpTypes);
      RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&pos.sourceCode);
      return pBVar3;
    }
    local_110 = BinaryOp::getSymbol(opType);
    iVar2 = (*(args_1->super_Object)._vptr_Object[2])(args_1);
    Type::getDescription_abi_cxx11_(&local_108,(Type *)CONCAT44(extraout_var_03,iVar2));
    iVar2 = (*(args_2->super_Object)._vptr_Object[2])(args_2);
    Type::getDescription_abi_cxx11_(&local_e8,(Type *)CONCAT44(extraout_var_04,iVar2));
    Errors::illegalTypesForBinaryOperator<char_const*,std::__cxx11::string,std::__cxx11::string>
              (&local_98,(Errors *)&local_110,(char **)&local_108,&local_e8,in_R8);
    CodeLocation::throwError(&pos,&local_98);
  }
  local_e8._M_dataplus._M_p = BinaryOp::getSymbol(opType);
  iVar2 = (*(args_1->super_Object)._vptr_Object[2])(args_1);
  Type::getDescription_abi_cxx11_((string *)&binOpTypes,(Type *)CONCAT44(extraout_var_01,iVar2));
  iVar2 = (*(args_2->super_Object)._vptr_Object[2])(args_2);
  Type::getDescription_abi_cxx11_(&local_108,(Type *)CONCAT44(extraout_var_02,iVar2));
  Errors::illegalTypesForBinaryOperator<char_const*,std::__cxx11::string,std::__cxx11::string>
            (&local_60,(Errors *)&local_e8,(char **)&binOpTypes,&local_108,in_R8);
  CodeLocation::throwError(&pos,&local_60);
}

Assistant:

heart::BinaryOperator& parseBinaryOp (const FunctionParseState& state, BinaryOp::Op opType)
    {
        auto pos = location;
        expect (HEARTOperator::openParen);
        auto& lhs = parseExpression (state);
        expect (HEARTOperator::comma);
        auto& rhs = parseExpression (state);
        expect (HEARTOperator::closeParen);
        const auto& lhsType = lhs.getType();

        if (! lhsType.isEqual (rhs.getType(), Type::ignoreReferences))
            pos.throwError (Errors::illegalTypesForBinaryOperator (BinaryOp::getSymbol (opType),
                                                                   lhs.getType().getDescription(),
                                                                   rhs.getType().getDescription()));

        const auto& operandType = lhsType;
        auto binOpTypes = BinaryOp::getTypes (opType, operandType, operandType);

        if (! binOpTypes.operandType.isEqual (operandType, Type::ignoreReferences))
            pos.throwError (Errors::illegalTypesForBinaryOperator (BinaryOp::getSymbol (opType),
                                                                   lhs.getType().getDescription(),
                                                                   rhs.getType().getDescription()));

        return module->allocate<heart::BinaryOperator> (pos, lhs, rhs, opType);
    }